

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void PerfomanceTester<long_long,_void>::Test(void)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[");
  pcVar2 = std::type_info::name((type_info *)&long_long::typeinfo);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"] skipped");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void Test()
    {
        std::cerr << "[" << typeid(T).name() << "] skipped" << std::endl;
    }